

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_thread.c
# Opt level: O2

int aom_set_worker_interface(AVxWorkerInterface *winterface)

{
  int iVar1;
  
  iVar1 = 0;
  if ((((winterface != (AVxWorkerInterface *)0x0) &&
       (winterface->init != (_func_void_AVxWorker_ptr *)0x0)) &&
      (winterface->reset != (_func_int_AVxWorker_ptr *)0x0)) &&
     (((winterface->sync != (_func_int_AVxWorker_ptr *)0x0 &&
       (winterface->launch != (_func_void_AVxWorker_ptr *)0x0)) &&
      ((winterface->execute != (_func_void_AVxWorker_ptr *)0x0 &&
       (winterface->end != (_func_void_AVxWorker_ptr *)0x0)))))) {
    g_worker_interface.init = winterface->init;
    g_worker_interface.reset = winterface->reset;
    g_worker_interface.sync = winterface->sync;
    g_worker_interface.launch = winterface->launch;
    g_worker_interface.execute = winterface->execute;
    g_worker_interface.end = winterface->end;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int aom_set_worker_interface(const AVxWorkerInterface *const winterface) {
  if (winterface == NULL || winterface->init == NULL ||
      winterface->reset == NULL || winterface->sync == NULL ||
      winterface->launch == NULL || winterface->execute == NULL ||
      winterface->end == NULL) {
    return 0;
  }
  g_worker_interface = *winterface;
  return 1;
}